

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uint32 value,uint8 *target)

{
  while( true ) {
    if (value < 0x80) break;
    *target = (byte)value | 0x80;
    value = value >> 7;
    target = target + 1;
  }
  *target = (byte)value;
  return target + 1;
}

Assistant:

inline uint8* CodedOutputStream::WriteVarint32ToArray(uint32 value,
                                                      uint8* target) {
  while (value >= 0x80) {
    *target = static_cast<uint8>(value | 0x80);
    value >>= 7;
    ++target;
  }
  *target = static_cast<uint8>(value);
  return target + 1;
}